

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

deUint32 tcu::anon_unknown_75::convertSatUint24<unsigned_int>(uint src)

{
  uint max;
  uint min;
  uint src_local;
  
  min = src;
  if (0xffffff < src) {
    min = 0xffffff;
  }
  return min;
}

Assistant:

static inline deUint32 convertSatUint24 (S src)
{
	S min = (S)0u;
	S max = (S)0xFFFFFFu;

	if (src < min)
		return (deUint32)min;
	else if (src > max)
		return (deUint32)max;
	else
		return (deUint32)src;
}